

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AsinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_asin(NeuralNetworkLayer *this)

{
  bool bVar1;
  AsinLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_asin(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_asin(this);
    this_00 = (AsinLayerParams *)operator_new(0x18);
    AsinLayerParams::AsinLayerParams(this_00);
    (this->layer_).asin_ = this_00;
  }
  return (AsinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AsinLayerParams* NeuralNetworkLayer::mutable_asin() {
  if (!has_asin()) {
    clear_layer();
    set_has_asin();
    layer_.asin_ = new ::CoreML::Specification::AsinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.asin)
  return layer_.asin_;
}